

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTimer.cpp
# Opt level: O1

int32_t __thiscall
helics::MessageTimer::addTimer(MessageTimer *this,time_type expirationTime,ActionMessage *mess)

{
  pointer psVar1;
  pointer psVar2;
  iterator __position;
  element_type *peVar3;
  service_type *psVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:50:26),_asio::any_io_executor>
  *pwVar6;
  long lVar7;
  wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:50:26),_asio::any_io_executor>
  *op;
  op_cancellation *poVar8;
  int32_t iVar9;
  implementation_type *impl;
  undefined8 uVar10;
  long *in_FS_OFFSET;
  associated_cancellation_slot_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:50:26)>
  slot;
  type timerCallback;
  unique_lock<std::mutex> lock;
  shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>
  timer;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_b8;
  ptr local_b0;
  type local_98;
  cancellation_slot local_80;
  shared_ptr<helics::MessageTimer> local_78;
  int32_t local_68;
  unique_lock<std::mutex> local_60;
  shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>
  local_50;
  per_timer_data *local_40;
  service_type *local_38;
  
  local_50.
  super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_b8.__d.__r = expirationTime.__d.__r;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>,std::allocator<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,asio::io_context&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_50.
              super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
              **)&local_50,
             (allocator<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>
              *)&local_b0,
             (io_context *)
             (((this->contextPtr).
               super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->ictx)._M_t.
             super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
             super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
             super__Head_base<0UL,_asio::io_context_*,_false>);
  peVar3 = local_50.
           super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_b0.h = (type *)((ulong)local_b0.h._4_4_ << 0x20);
  pwVar6 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:50:26),_asio::any_io_executor>
            *)std::_V2::system_category();
  impl = &(peVar3->impl_).implementation_;
  local_b0.v = pwVar6;
  asio::detail::
  deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  ::cancel((peVar3->impl_).service_,impl,(error_code *)&local_b0);
  (impl->expiry).__d.__r = (rep)local_b8.__d.__r;
  local_60._M_device = &this->timerLock;
  local_60._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_60);
  local_60._M_owns = true;
  psVar1 = (this->timers).
           super__Vector_base<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar2 = (this->timers).
           super__Vector_base<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__shared_ptr<helics::MessageTimer,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<helics::MessageTimer,void>
            ((__shared_ptr<helics::MessageTimer,(__gnu_cxx::_Lock_policy)2> *)&local_78,
             (__weak_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2> *)this);
  iVar9 = (int32_t)((ulong)((long)psVar1 - (long)psVar2) >> 4);
  local_68 = iVar9;
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
  emplace_back<helics::ActionMessage>(&this->buffers,mess);
  __position._M_current =
       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        *)(this->expirationTimes).
          super__Vector_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
       *)(this->expirationTimes).
         super__Vector_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>
    ::
    _M_realloc_insert<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const&>
              ((vector<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>
                *)&this->expirationTimes,__position,&local_b8);
  }
  else {
    ((__position._M_current)->__d).__r = (rep)local_b8.__d.__r;
    (this->expirationTimes).
    super__Vector_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)(__position._M_current + 1);
  }
  std::
  vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>>>
  ::
  emplace_back<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>>
            ((vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>>>
              *)&this->timers,&local_50);
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (lVar7 < (long)local_b8.__d.__r) {
    peVar3 = (this->timers).
             super__Vector_base<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].
             super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_98.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_78.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_98.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_78.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    if (local_78.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_78.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_78.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_78.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_78.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_b0.h = &local_98;
    local_98.index = local_68;
    psVar4 = (peVar3->impl_).service_;
    local_80.handler_ = (cancellation_handler_base **)0x0;
    if (*(long *)(*in_FS_OFFSET + -0x1420) == 0) {
      uVar10 = 0;
    }
    else {
      uVar10 = *(undefined8 *)(*(long *)(*in_FS_OFFSET + -0x1420) + 8);
    }
    op = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:50:26),_asio::any_io_executor>
          *)asio::detail::thread_info_base::allocate<asio::detail::thread_info_base::default_tag>
                      (uVar10,0x80,8);
    _Var5._M_pi = local_98.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    local_b0.p = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:50:26),_asio::any_io_executor>
                  *)0x0;
    (op->super_wait_op).super_operation.next_ = (scheduler_operation *)0x0;
    (op->super_wait_op).super_operation.func_ =
         asio::detail::
         wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:50:26),_asio::any_io_executor>
         ::do_complete;
    (op->super_wait_op).super_operation.task_result_ = 0;
    (op->super_wait_op).ec_._M_value = 0;
    (op->super_wait_op).ec_._M_cat = (error_category *)pwVar6;
    (op->super_wait_op).cancellation_key_ = (void *)0x0;
    (op->handler_).ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_98.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (op->handler_).ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_98.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (op->handler_).ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var5._M_pi;
    local_98.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (op->handler_).index = local_98.index;
    local_b0.v = op;
    asio::detail::
    handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>::
    handler_work_base(&(op->work_).
                       super_handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>
                      ,0,0,&(peVar3->impl_).executor_);
    local_b0.p = op;
    if (local_80.handler_ != (cancellation_handler_base **)0x0) {
      local_40 = &(peVar3->impl_).implementation_.timer_data;
      local_38 = psVar4;
      poVar8 = asio::cancellation_slot::
               emplace<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>::op_cancellation,asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>*,asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>::per_timer_data*>
                         (&local_80,&local_38,&local_40);
      (op->super_wait_op).cancellation_key_ = poVar8;
    }
    (peVar3->impl_).implementation_.might_have_pending_waits = true;
    asio::detail::epoll_reactor::
    schedule_timer<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
              (psVar4->scheduler_,&psVar4->timer_queue_,&(peVar3->impl_).implementation_.expiry,
               &(peVar3->impl_).implementation_.timer_data,(wait_op *)op);
    local_b0.v = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:50:26),_asio::any_io_executor>
                  *)0x0;
    local_b0.p = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:50:26),_asio::any_io_executor>
                  *)0x0;
    asio::detail::
    wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:50:26),_asio::any_io_executor>
    ::ptr::reset(&local_b0);
    if (local_98.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  else {
    std::unique_lock<std::mutex>::unlock(&local_60);
    local_b0.h = (type *)((ulong)local_b0.h & 0xffffffff00000000);
    local_b0.v = pwVar6;
    processTimerCallback(&local_78,local_68,(error_code *)&local_b0);
  }
  if (local_78.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_60);
  if (local_50.
      super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.
               super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return iVar9;
}

Assistant:

int32_t MessageTimer::addTimer(time_type expirationTime, ActionMessage mess)
{
    // these two calls need to be before the lock
    auto timer = std::make_shared<asio::steady_timer>(contextPtr->getBaseContext());
    timer->expires_at(expirationTime);

    std::unique_lock<std::mutex> lock(timerLock);

    auto index = static_cast<int32_t>(timers.size());
    auto timerCallback = [ptr = shared_from_this(), index](const std::error_code& ec) {
        processTimerCallback(ptr, index, ec);
    };
    buffers.push_back(std::move(mess));
    expirationTimes.push_back(expirationTime);
    timers.push_back(std::move(timer));
    if (expirationTime > std::chrono::steady_clock::now()) {
        timers.back()->async_wait(timerCallback);
    } else {
        lock.unlock();
        timerCallback(std::error_code{});
    }

    return index;
}